

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbm.cc
# Opt level: O2

void tchecker::dbm::universal_positive(db_t *dbm,clock_id_t dim)

{
  ulong uVar1;
  uint __line;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  char *__assertion;
  db_t dVar6;
  
  if (dbm == (db_t *)0x0) {
    __assertion = "dbm != nullptr";
    __line = 0x34;
  }
  else {
    uVar1 = (ulong)dim;
    if (dim == 0) {
      __assertion = "dim >= 1";
      __line = 0x35;
    }
    else {
      lVar3 = 0;
      for (uVar4 = 0; uVar4 != uVar1; uVar4 = uVar4 + 1) {
        for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
          dVar6 = (db_t)0x7ffffffe;
          if (uVar4 == uVar5) {
            dVar6 = (db_t)0x1;
          }
          if (uVar4 == 0) {
            dVar6 = (db_t)0x1;
          }
          dbm[(uint)((int)lVar3 + (int)uVar5)] = dVar6;
        }
        lVar3 = lVar3 + uVar1;
      }
      bVar2 = is_consistent(dbm,dim);
      if (bVar2) {
        bVar2 = is_positive(dbm,dim);
        if (bVar2) {
          bVar2 = is_tight(dbm,dim);
          if (bVar2) {
            return;
          }
          __assertion = "tchecker::dbm::is_tight(dbm, dim)";
          __line = 0x3b;
        }
        else {
          __assertion = "tchecker::dbm::is_positive(dbm, dim)";
          __line = 0x3a;
        }
      }
      else {
        __assertion = "tchecker::dbm::is_consistent(dbm, dim)";
        __line = 0x39;
      }
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/dbm.cc"
                ,__line,
                "void tchecker::dbm::universal_positive(tchecker::dbm::db_t *, tchecker::clock_id_t)"
               );
}

Assistant:

void universal_positive(tchecker::dbm::db_t * dbm, tchecker::clock_id_t dim)
{
  assert(dbm != nullptr);
  assert(dim >= 1);
  for (tchecker::clock_id_t i = 0; i < dim; ++i)
    for (tchecker::clock_id_t j = 0; j < dim; ++j)
      DBM(i, j) = ((i == j) || (i == 0) ? tchecker::dbm::LE_ZERO : tchecker::dbm::LT_INFINITY);
  assert(tchecker::dbm::is_consistent(dbm, dim));
  assert(tchecker::dbm::is_positive(dbm, dim));
  assert(tchecker::dbm::is_tight(dbm, dim));
}